

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

void __thiscall
axl::sl::
OwningListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::SerialPortDesc>_>
::clear(OwningListBase<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::SerialPortDesc,_axl::sl::ImplicitPtrCast<axl::io::SerialPortDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::SerialPortDesc>_>
        *this)

{
  SerialPortDesc *pSVar1;
  SerialPortDesc *p;
  Delete<axl::io::SerialPortDesc> local_19;
  
  if (*(SerialPortDesc **)this != (SerialPortDesc *)0x0) {
    p = *(SerialPortDesc **)this;
    while (p != (SerialPortDesc *)0x0) {
      pSVar1 = (SerialPortDesc *)(p->super_ListLink).m_next;
      mem::Delete<axl::io::SerialPortDesc>::operator()(&local_19,p);
      p = pSVar1;
    }
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}